

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaRead.c
# Opt level: O0

int Pla_ReadPlaHeader(char *pBuffer,char *pLimit,int *pnIns,int *pnOuts,int *pnCubes,int *pType)

{
  int iVar1;
  bool local_a9;
  char local_a8 [8];
  char Buffer [100];
  char *pTemp;
  int *pType_local;
  int *pnCubes_local;
  int *pnOuts_local;
  int *pnIns_local;
  char *pLimit_local;
  char *pBuffer_local;
  
  *pType = 0;
  *pnCubes = -1;
  *pnOuts = -1;
  *pnIns = -1;
  for (unique0x100001fe = pBuffer; stack0xffffffffffffffc0 < pLimit;
      register0x00000000 = stack0xffffffffffffffc0 + 1) {
    if (*stack0xffffffffffffffc0 == '.') {
      iVar1 = strncmp(stack0xffffffffffffffc0,".i ",3);
      if (iVar1 == 0) {
        iVar1 = atoi(stack0xffffffffffffffc0 + 3);
        *pnIns = iVar1;
      }
      else {
        iVar1 = strncmp(stack0xffffffffffffffc0,".o ",3);
        if (iVar1 == 0) {
          iVar1 = atoi(stack0xffffffffffffffc0 + 3);
          *pnOuts = iVar1;
        }
        else {
          iVar1 = strncmp(stack0xffffffffffffffc0,".p ",3);
          if (iVar1 == 0) {
            iVar1 = atoi(stack0xffffffffffffffc0 + 3);
            *pnCubes = iVar1;
          }
          else {
            iVar1 = strncmp(stack0xffffffffffffffc0,".e ",3);
            if (iVar1 == 0) break;
            iVar1 = strncmp(stack0xffffffffffffffc0,".type ",6);
            if (iVar1 == 0) {
              *pType = 4;
              __isoc99_sscanf(stack0xffffffffffffffc0 + 6,"%s",local_a8);
              iVar1 = strcmp(local_a8,"f");
              if (iVar1 == 0) {
                *pType = 1;
              }
              else {
                iVar1 = strcmp(local_a8,"fr");
                if (iVar1 == 0) {
                  *pType = 2;
                }
                else {
                  iVar1 = strcmp(local_a8,"fd");
                  if (iVar1 == 0) {
                    *pType = 0;
                  }
                  else {
                    iVar1 = strcmp(local_a8,"fdr");
                    if (iVar1 == 0) {
                      *pType = 3;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*pnIns < 1) {
    printf("The number of inputs (.i) should be positive.\n");
  }
  if (*pnOuts < 1) {
    printf("The number of outputs (.o) should be positive.\n");
  }
  local_a9 = false;
  if (0 < *pnIns) {
    local_a9 = 0 < *pnOuts;
  }
  return (int)local_a9;
}

Assistant:

int Pla_ReadPlaHeader( char * pBuffer, char * pLimit, int * pnIns, int * pnOuts, int * pnCubes, int * pType )
{
    char * pTemp; 
    *pType = PLA_FILE_FD;
    *pnIns = *pnOuts = *pnCubes = -1;
    for ( pTemp = pBuffer; pTemp < pLimit; pTemp++ )
    {
        if ( *pTemp != '.' )
            continue;
        if ( !strncmp(pTemp, ".i ", 3) )
            *pnIns = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".o ", 3) )
            *pnOuts = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".p ", 3) )
            *pnCubes = atoi( pTemp + 3 );
        else if ( !strncmp(pTemp, ".e ", 3) )
            break;
        else if ( !strncmp(pTemp, ".type ", 6) )
        {
            char Buffer[100];
            *pType = PLA_FILE_NONE;
            sscanf( pTemp+6, "%s", Buffer );
            if ( !strcmp(Buffer, "f") )
                *pType = PLA_FILE_F;
            else if ( !strcmp(Buffer, "fr") )
                *pType = PLA_FILE_FR;
            else if ( !strcmp(Buffer, "fd") )
                *pType = PLA_FILE_FD;
            else if ( !strcmp(Buffer, "fdr") )
                *pType = PLA_FILE_FDR;
        }
    }
    if ( *pnIns <= 0 )
        printf( "The number of inputs (.i) should be positive.\n" );
    if ( *pnOuts <= 0 )
        printf( "The number of outputs (.o) should be positive.\n" );
    return *pnIns > 0 && *pnOuts > 0;
}